

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app.cpp
# Opt level: O2

void __thiscall App::keyPressed(App *this,int key)

{
  bool towardsLeft;
  
  switch(key) {
  case 0x101:
    if ((this->state < 4) && (this->state != GAME)) {
      reset(this);
      this->state = GAME;
    }
  case 0x102:
  case 0x103:
  case 0x104:
  case 0x105:
    return;
  case 0x107:
switchD_00133e18_caseD_107:
    towardsLeft = true;
    break;
  case 0x108:
switchD_00133e18_caseD_108:
    Character::startDucking(&this->character);
    return;
  case 0x109:
switchD_00133e18_caseD_109:
    Character::startJumping(&this->character);
    return;
  default:
    if ((key == 0x20) || (key == 0x57)) goto switchD_00133e18_caseD_109;
    if (key != 0x44) {
      if (key == 0x53) goto switchD_00133e18_caseD_108;
      if (key != 0x41) {
        return;
      }
      goto switchD_00133e18_caseD_107;
    }
  case 0x106:
    towardsLeft = false;
  }
  Character::startRunning(&this->character,towardsLeft);
  return;
}

Assistant:

void App::keyPressed(int key) {
    switch (key) {
        case 263: // left arrow
        case 'A':
            character.startRunning(true);
            break;
        case 262: // right arrow
        case 'D':
            character.startRunning(false);
            break;
        case 265: // up arrow
        case 'W':
        case ' ':
            character.startJumping();
            break;
        case 264: // down arrow
        case 'S':
            character.startDucking();
            // bricks.clear(); // for debug
            break;
        case 257: // enter
            if (state == STARTSCREEN || state == GAMEOVER || state == VICTORY) {
                reset();
                state = GAME;
            }
    }
}